

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void CVmObjTable::call_post_load_init(CVmHashEntryPLI *entry)

{
  vm_obj_id_t vVar1;
  uint uVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  
  if (entry->status == PLI_UNINITED) {
    entry->status = PLI_IN_PROGRESS;
    pvVar4 = sp_;
    vVar1 = *(vm_obj_id_t *)&(entry->super_CVmHashEntryCS).super_CVmHashEntry.field_0x24;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar4->val).obj = vVar1;
    uVar2 = *(uint *)&(entry->super_CVmHashEntryCS).super_CVmHashEntry.field_0x24;
    (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0xc0))();
    entry->status = PLI_INITED;
    sp_ = sp_ + -1;
  }
  else if (entry->status == PLI_IN_PROGRESS) {
    err_throw(0xce);
  }
  return;
}

Assistant:

void CVmObjTable::call_post_load_init(VMG_ CVmHashEntryPLI *entry)
{
    /* check the status */
    switch (entry->status)
    {
    case PLI_UNINITED:
        /*  
         *   It's not yet initialized, so we need to initialize it now.  Mark
         *   it as having its initialization in progress.  
         */
        entry->status = PLI_IN_PROGRESS;

        /* 
         *   push the entry on the stack to protect it from gc while we're
         *   initializing it 
         */
        G_stk->push()->set_obj(entry->id_);

        /* invoke its initialization */
        vm_objp(vmg_ entry->id_)->post_load_init(vmg_ entry->id_);

        /* mark the object as having completed initialization */
        entry->status = PLI_INITED;

        /* discard our GC protection */
        G_stk->discard();

        /* done */
        break;

    case PLI_IN_PROGRESS:
        /*
         *   The object is in the process of being initialized.  This must
         *   mean that the object's initializer is calling us indirectly,
         *   probably through another object's initializer that it invoked
         *   explicitly as a dependency, which in turn means that we have a
         *   circular dependency.  This is illegal, so abort with an error.  
         */
        err_throw(VMERR_CIRCULAR_INIT);
        break;

    case PLI_INITED:
        /* it's already been initialized, so there's nothing to do */
        break;
    }
}